

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

SubControl __thiscall QComboBoxPrivate::newHoverControl(QComboBoxPrivate *this,QPoint *pos)

{
  SubControl SVar1;
  QComboBox *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QComboBox *q;
  QStyleOptionComboBox opt;
  undefined4 in_stack_ffffffffffffff28;
  SubControl in_stack_ffffffffffffff2c;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined1 local_98 [144];
  long local_8;
  
  QVar4._8_8_ = uStack_a4;
  QVar4._0_8_ = local_ac;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  memset(local_98,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x5317f8);
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1b8))(pQVar2,local_98);
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffff2c)
  ;
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  SVar1 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,1,local_98,in_RSI,pQVar2);
  in_RDI->hoverControl = SVar1;
  if (in_RDI->hoverControl == SC_None) {
    QRect::QRect((QRect *)in_RDI);
  }
  else {
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    QVar4 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))
                             (pQVar3,1,local_98,in_RDI->hoverControl,pQVar2);
  }
  in_RDI->hoverRect = QVar4;
  SVar1 = in_RDI->hoverControl;
  QStyleOptionComboBox::~QStyleOptionComboBox((QStyleOptionComboBox *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QComboBoxPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt, pos, q);
    hoverRect = (hoverControl != QStyle::SC_None)
                   ? q->style()->subControlRect(QStyle::CC_ComboBox, &opt, hoverControl, q)
                   : QRect();
    return hoverControl;
}